

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::IsArray(RecyclableObject *instance)

{
  bool bVar1;
  undefined1 uVar2;
  BOOL BVar3;
  JavascriptProxy *instance_00;
  
  bVar1 = DynamicObject::IsAnyArray(instance);
  uVar2 = 1;
  if (!bVar1) {
    bVar1 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(instance);
    if (bVar1) {
      instance_00 = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(instance);
      if (instance_00 != (JavascriptProxy *)0x0) {
        bVar1 = IsArray(instance_00);
        return bVar1;
      }
    }
    BVar3 = IsRemoteArray(instance);
    uVar2 = (undefined1)BVar3;
  }
  return (bool)uVar2;
}

Assistant:

bool JavascriptOperators::IsArray(_In_ RecyclableObject* instance)
    {
        if (DynamicObject::IsAnyArray(instance))
        {
            return TRUE;
        }

        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            return IsArray(proxy);
        }

        return IsRemoteArray(instance);
    }